

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenInitialize
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_list)

{
  FieldDef *field;
  string *psVar1;
  _Base_ptr p_Var2;
  pointer ppFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> struct_import;
  string default_value;
  string field_field;
  BaseType base_type;
  IdlNamer *local_170;
  string *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  import_typing_list;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  code._M_dataplus._M_p = (pointer)&code.field_2;
  code._M_string_length = 0;
  import_typing_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &import_typing_list._M_t._M_impl.super__Rb_tree_header._M_header;
  import_typing_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  import_typing_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  import_typing_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  code.field_2._M_local_buf[0] = '\0';
  local_170 = &this->namer_;
  local_168 = code_ptr;
  import_typing_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       import_typing_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppFVar3 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar1 = local_168,
      ppFVar3 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    field = *ppFVar3;
    if (field->deprecated == false) {
      base_type = (field->value).type.base_type;
      struct_import._M_dataplus._M_p = (pointer)&struct_import.field_2;
      struct_import._M_string_length = 0;
      struct_import.field_2._M_local_buf[0] = '\0';
      switch(base_type) {
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY:
        GenVectorInit(this,field,&struct_import,import_list,&import_typing_list);
        break;
      case BASE_TYPE_STRUCT:
        GenStructInit(this,field,&struct_import,import_list,&import_typing_list);
        break;
      case BASE_TYPE_UNION:
        GenUnionInit(this,field,&struct_import,import_list,&import_typing_list);
        break;
      default:
        GetBasePythonTypeForScalarAndString_abi_cxx11_(&default_value,this,&base_type);
        std::__cxx11::string::operator=((string *)&struct_import,(string *)&default_value);
        std::__cxx11::string::~string((string *)&default_value);
        if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
           (field->presence == kOptional)) {
          std::operator+(&field_field,"Optional[",&struct_import);
          std::operator+(&default_value,&field_field,"]");
          std::__cxx11::string::operator=((string *)&struct_import,(string *)&default_value);
          std::__cxx11::string::~string((string *)&default_value);
          std::__cxx11::string::~string((string *)&field_field);
        }
      }
      GetDefaultValue_abi_cxx11_(&default_value,this,field);
      (*(local_170->super_Namer)._vptr_Namer[0x12])(&field_field,local_170,field);
      GenIndents_abi_cxx11_(&local_50,this,2);
      std::operator+(&local_f0,&local_50,"self.");
      std::operator+(&local_d0,&local_f0,&field_field);
      std::operator+(&local_b0,&local_d0," = ");
      std::operator+(&local_90,&local_b0,&default_value);
      std::operator+(&local_70,&local_90,"  # type: ");
      std::operator+(&local_160,&local_70,&struct_import);
      std::__cxx11::string::append((string *)&code);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&field_field);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::~string((string *)&struct_import);
    }
  }
  GenReceiverForObjectAPI(this,struct_def,local_168);
  std::__cxx11::string::append((char *)psVar1);
  if (code._M_string_length == 0) {
    GenIndents_abi_cxx11_(&default_value,this,2);
    std::operator+(&struct_import,&default_value,"pass");
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&struct_import);
    std::__cxx11::string::~string((string *)&default_value);
  }
  else {
    std::__cxx11::string::append((string *)psVar1);
  }
  std::__cxx11::string::append((char *)psVar1);
  if (import_typing_list._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&struct_import,"try:",(allocator<char> *)&default_value);
    GenIndents_abi_cxx11_(&field_field,this,1);
    std::operator+(&default_value,&field_field,"from typing import ");
    std::__cxx11::string::append((string *)&struct_import);
    std::__cxx11::string::~string((string *)&default_value);
    std::__cxx11::string::~string((string *)&field_field);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&default_value,", ",(allocator<char> *)&field_field);
    for (p_Var2 = import_typing_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &import_typing_list._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::operator+(&field_field,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var2 + 1),&default_value);
      std::__cxx11::string::append((string *)&struct_import);
      std::__cxx11::string::~string((string *)&field_field);
    }
    std::__cxx11::string::erase
              ((ulong)&struct_import,struct_import._M_string_length - default_value._M_string_length
              );
    std::__cxx11::string::append((char *)&struct_import);
    std::__cxx11::string::append((char *)&struct_import);
    GenIndents_abi_cxx11_(&local_160,this,1);
    std::operator+(&field_field,&local_160,"pass");
    std::__cxx11::string::append((string *)&struct_import);
    std::__cxx11::string::~string((string *)&field_field);
    std::__cxx11::string::~string((string *)&local_160);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)import_list,&struct_import);
    std::__cxx11::string::~string((string *)&default_value);
    std::__cxx11::string::~string((string *)&struct_import);
  }
  IdlNamer::NamespacedType_abi_cxx11_(&default_value,local_170,&struct_def->super_Definition);
  std::operator+(&struct_import,"import ",&default_value);
  std::__cxx11::string::~string((string *)&default_value);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&import_list->_M_t,&struct_import);
  std::__cxx11::string::~string((string *)&struct_import);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&import_typing_list._M_t);
  std::__cxx11::string::~string((string *)&code);
  return;
}

Assistant:

void GenInitialize(const StructDef &struct_def, std::string *code_ptr,
                     std::set<std::string> *import_list) const {
    std::string code;
    std::set<std::string> import_typing_list;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      // Determines field type, default value, and typing imports.
      auto base_type = field.value.type.base_type;
      std::string field_type;
      switch (base_type) {
        case BASE_TYPE_UNION: {
          GenUnionInit(field, &field_type, import_list, &import_typing_list);
          break;
        }
        case BASE_TYPE_STRUCT: {
          GenStructInit(field, &field_type, import_list, &import_typing_list);
          break;
        }
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_ARRAY: {
          GenVectorInit(field, &field_type, import_list, &import_typing_list);
          break;
        }
        default:
          // Scalar or sting fields.
          field_type = GetBasePythonTypeForScalarAndString(base_type);
          if (field.IsScalarOptional()) {
            field_type = "Optional[" + field_type + "]";
          }
          break;
      }

      const auto default_value = GetDefaultValue(field);
      // Wrties the init statement.
      const auto field_field = namer_.Field(field);
      code += GenIndents(2) + "self." + field_field + " = " + default_value +
              "  # type: " + field_type;
    }

    // Writes __init__ method.
    auto &code_base = *code_ptr;
    GenReceiverForObjectAPI(struct_def, code_ptr);
    code_base += "__init__(self):";
    if (code.empty()) {
      code_base += GenIndents(2) + "pass";
    } else {
      code_base += code;
    }
    code_base += "\n";

    // Merges the typing imports into import_list.
    if (!import_typing_list.empty()) {
      // Adds the try statement.
      std::string typing_imports = "try:";
      typing_imports += GenIndents(1) + "from typing import ";
      std::string separator_string = ", ";
      for (auto it = import_typing_list.begin(); it != import_typing_list.end();
           ++it) {
        const std::string &im = *it;
        typing_imports += im + separator_string;
      }
      // Removes the last separator_string.
      typing_imports.erase(typing_imports.length() - separator_string.size());

      // Adds the except statement.
      typing_imports += "\n";
      typing_imports += "except:";
      typing_imports += GenIndents(1) + "pass";
      import_list->insert(typing_imports);
    }

    // Removes the import of the struct itself, if applied.
    auto struct_import = "import " + namer_.NamespacedType(struct_def);
    import_list->erase(struct_import);
  }